

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Iter * fts5MultiIterAlloc(Fts5Index *p,int nSeg)

{
  Fts5Iter *pFVar1;
  int in_ESI;
  Fts5Index *in_RDI;
  i64 nSlot;
  Fts5Iter *pNew;
  sqlite3_int64 in_stack_ffffffffffffffd8;
  Fts5Index *p_00;
  
  for (p_00 = (Fts5Index *)&DAT_00000002; (long)p_00 < (long)in_ESI;
      p_00 = (Fts5Index *)((long)p_00 << 1)) {
  }
  pFVar1 = (Fts5Iter *)fts5IdxMalloc(p_00,in_stack_ffffffffffffffd8);
  if (pFVar1 != (Fts5Iter *)0x0) {
    pFVar1->nSeg = (int)p_00;
    pFVar1->aFirst = (Fts5CResult *)(pFVar1->aSeg + (long)p_00);
    pFVar1->pIndex = in_RDI;
    pFVar1->xSetOutputs = fts5IterSetOutputs_Noop;
  }
  return pFVar1;
}

Assistant:

static Fts5Iter *fts5MultiIterAlloc(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  int nSeg
){
  Fts5Iter *pNew;
  i64 nSlot;                      /* Power of two >= nSeg */

  for(nSlot=2; nSlot<nSeg; nSlot=nSlot*2);
  pNew = fts5IdxMalloc(p,
      sizeof(Fts5Iter) +                  /* pNew */
      sizeof(Fts5SegIter) * (nSlot-1) +   /* pNew->aSeg[] */
      sizeof(Fts5CResult) * nSlot         /* pNew->aFirst[] */
  );
  if( pNew ){
    pNew->nSeg = nSlot;
    pNew->aFirst = (Fts5CResult*)&pNew->aSeg[nSlot];
    pNew->pIndex = p;
    pNew->xSetOutputs = fts5IterSetOutputs_Noop;
  }
  return pNew;
}